

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

void __thiscall SQFunctionProto::Release(SQFunctionProto *this)

{
  SQOuterVar *in_RDI;
  SQInteger size;
  SQInteger nl_4;
  SQInteger nl_3;
  SQInteger nl_2;
  SQInteger nl_1;
  SQInteger nl;
  SQUnsignedInteger in_stack_ffffffffffffffb8;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  for (local_10 = 0; local_10 < in_RDI[3]._name.super_SQObject._unVal.nInteger;
      local_10 = local_10 + 1) {
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  }
  for (local_18 = 0; local_18 < in_RDI[3]._src.super_SQObject._unVal.nInteger;
      local_18 = local_18 + 1) {
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  }
  for (local_20 = 0; local_20 < ((SQObjectValue *)&in_RDI[4]._name)->nInteger;
      local_20 = local_20 + 1) {
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  }
  for (local_28 = 0; local_28 < *(long *)&in_RDI[4]._src.super_SQObject; local_28 = local_28 + 1) {
    SQOuterVar::~SQOuterVar(in_RDI);
  }
  for (local_30 = 0; local_30 < *(long *)&in_RDI[2]._src.super_SQObject; local_30 = local_30 + 1) {
    SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)0x129014);
  }
  (*(code *)**(undefined8 **)in_RDI)();
  sq_vm_free(in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void Release(){
        _DESTRUCT_VECTOR(SQObjectPtr,_nliterals,_literals);
        _DESTRUCT_VECTOR(SQObjectPtr,_nparameters,_parameters);
        _DESTRUCT_VECTOR(SQObjectPtr,_nfunctions,_functions);
        _DESTRUCT_VECTOR(SQOuterVar,_noutervalues,_outervalues);
        //_DESTRUCT_VECTOR(SQLineInfo,_nlineinfos,_lineinfos); //not required are 2 integers
        _DESTRUCT_VECTOR(SQLocalVarInfo,_nlocalvarinfos,_localvarinfos);
        SQInteger size = _FUNC_SIZE(_ninstructions,_nliterals,_nparameters,_nfunctions,_noutervalues,_nlineinfos,_nlocalvarinfos,_ndefaultparams);
        this->~SQFunctionProto();
        sq_vm_free(this,size);
    }